

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall Js::AsmJsModuleCompiler::CompileAllFunctions(AsmJsModuleCompiler *this)

{
  undefined1 *puVar1;
  int iVar2;
  AsmJsFunc *func;
  bool bVar3;
  Type *ppAVar4;
  int funcIndex;
  int index;
  int j;
  int iVar5;
  
  iVar2 = (this->mFunctionArray).
          super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  iVar5 = 0;
  index = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
    index = 0;
  }
  while( true ) {
    if (iVar5 == index) goto LAB_008702fc;
    ppAVar4 = JsUtil::
              List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->mFunctionArray,index);
    func = *ppAVar4;
    bVar3 = CompileFunction(this,func,funcIndex);
    if (!bVar3) break;
    puVar1 = &func->field_0xd3;
    *puVar1 = *puVar1 | 1;
    index = index + 1;
  }
  for (iVar5 = 0; iVar5 <= index; iVar5 = iVar5 + 1) {
    RevertFunction(this,iVar5);
  }
LAB_008702fc:
  return iVar2 <= index;
}

Assistant:

bool AsmJsModuleCompiler::CompileAllFunctions()
    {
        const int size = mFunctionArray.Count();

        for (int i = 0; i < size; i++)
        {
            AsmJsFunc* func = mFunctionArray.Item(i);

            if (!CompileFunction(func, i))
            {
                // an error occurred in the function, revert state on all asm.js functions
                for (int j = 0; j <= i; j++)
                {
                    RevertFunction(j);
                }
                return false;
            }
            func->Finish();
        }
        return true;
    }